

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

void magic_map_background(xchar x,xchar y,int show)

{
  uint uVar1;
  rm *prVar2;
  rm *loc_override;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  uint bg;
  rm tmp_loc;
  
  iVar4 = (int)CONCAT71(in_register_00000039,x);
  iVar3 = (int)CONCAT71(in_register_00000031,y);
  uVar1 = back_to_cmap(level,x,y);
  prVar2 = level->locations[iVar4] + iVar3;
  loc_override = prVar2;
  if (((level->flags).field_0x9 & 0x40) == 0) {
    loc_override = &tmp_loc;
    tmp_loc._8_4_ = *(undefined4 *)&level->locations[iVar4][iVar3].field_0x8;
    tmp_loc._0_4_ = *(undefined4 *)&prVar2->field_0x0;
    tmp_loc.typ = prVar2->typ;
    tmp_loc.seenv = prVar2->seenv;
    tmp_loc._6_2_ = *(undefined2 *)&prVar2->field_0x6;
  }
  bg = uVar1;
  if (((viz_array[iVar3][iVar4] & 2U) == 0) && ((loc_override->field_0x7 & 8) == 0)) {
    bg = 0x10;
    if (loc_override->typ != '\x19' || uVar1 != 0xf) {
      bg = 0xd;
      if (uVar1 != 0xe) {
        bg = uVar1;
      }
      if (loc_override->typ != '\x18') {
        bg = uVar1;
      }
    }
  }
  *(uint *)loc_override = *(uint *)loc_override & 0xffffffc0 | bg & 0x3f;
  *(uint *)&loc_override->field_0x6 =
       (uint)(bg - 0x19 < 4) * 3 | *(uint *)&loc_override->field_0x6 & 0xfffffffc;
  if (show != 0) {
    dbuf_set(level,(int)x,(int)y,loc_override,bg,0,0,0,0,0,0,0,0,0);
  }
  return;
}

Assistant:

void magic_map_background(xchar x, xchar y, int show)
{
    int cmap = back_to_cmap(level, x, y);	/* assumes hero can see x,y */
    struct rm *loc = &level->locations[x][y];
    struct rm tmp_loc;

    if (!level->flags.hero_memory) {
	tmp_loc = *loc;
	loc = &tmp_loc;
    }

    /*
     * Correct for out of sight lit corridors and rooms that the hero
     * doesn't remember as lit.
     */
    if (!cansee(x,y) && !loc->waslit) {
	/* Floor spaces are dark if unlit.  Corridors are dark if unlit. */
	if (loc->typ == ROOM && cmap == S_room)
	    cmap = S_darkroom;
	else if (loc->typ == CORR && cmap == S_litcorr)
	    cmap = S_corr;
    }
    loc->mem_bg = cmap;
    if (cmap == S_vodoor || cmap == S_hodoor ||
	cmap == S_vcdoor || cmap == S_hcdoor) {
	loc->mem_door_l = 1;
	loc->mem_door_t = 1;
    } else {
	loc->mem_door_l = 0;
	loc->mem_door_t = 0;
    }

    if (show)
	dbuf_set(level, x, y, loc, cmap, 0, 0, 0, 0, 0, 0, 0, 0, 0);
}